

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O0

QVariant * __thiscall QGenericUnixTheme::themeHint(QGenericUnixTheme *this,ThemeHint hint)

{
  DataPointer *dd;
  QSize QVar1;
  int in_EDX;
  undefined8 in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  char16_t *str_2;
  char16_t *str;
  char16_t *str_1;
  QStringList styleNames;
  DataPointer *in_stack_fffffffffffffe78;
  QArrayDataPointer<char16_t> *pQVar2;
  undefined1 local_f8 [24];
  QArrayDataPointer<char16_t> local_e0 [2];
  QArrayDataPointer<char16_t> local_b0 [2];
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  QArrayDataPointer<char16_t> local_38;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch((QPlatformTheme *)(ulong)(in_EDX - 0xf)) {
  case (QPlatformTheme *)0x0:
    pQVar2 = in_RDI;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_38,(Data *)0x0,L"hicolor",7);
    QString::QString((QString *)pQVar2,in_stack_fffffffffffffe78);
    ::QVariant::QVariant((QVariant *)pQVar2,(QString *)local_20);
    QString::~QString((QString *)0xae3e90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar2);
    break;
  case (QPlatformTheme *)0x1:
    pQVar2 = in_RDI;
    xdgIconThemePaths();
    ::QVariant::QVariant((QVariant *)pQVar2,(QList_conflict3 *)local_50);
    QList<QString>::~QList((QList<QString> *)0xae3ece);
    break;
  case (QPlatformTheme *)0x2:
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = in_RDI;
    QList<QString>::QList((QList<QString> *)0xae3f52);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_b0,(Data *)0x0,L"Fusion",6);
    QString::QString((QString *)pQVar2,in_stack_fffffffffffffe78);
    dd = (DataPointer *)
         QList<QString>::operator<<((QList<QString> *)pQVar2,(rvalue_ref)in_stack_fffffffffffffe78);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_e0,(Data *)0x0,L"Windows",7);
    QString::QString((QString *)pQVar2,dd);
    QList<QString>::operator<<((QList<QString> *)pQVar2,(rvalue_ref)dd);
    QString::~QString((QString *)0xae4038);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar2);
    QString::~QString((QString *)0xae4052);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar2);
    ::QVariant::QVariant((QVariant *)pQVar2,(QList_conflict3 *)&local_80);
    QList<QString>::~QList((QList<QString> *)0xae407e);
    break;
  default:
    QPlatformTheme::themeHint
              ((QPlatformTheme *)(ulong)(in_EDX - 0xf),(ThemeHint)((ulong)in_RSI >> 0x20));
    break;
  case (QPlatformTheme *)0x5:
    ::QVariant::QVariant((QVariant *)in_RDI,true);
    break;
  case (QPlatformTheme *)0x7:
    ::QVariant::QVariant((QVariant *)in_RDI,2);
    break;
  case (QPlatformTheme *)0x8:
    ::QVariant::QVariant((QVariant *)in_RDI,0x80);
    break;
  case (QPlatformTheme *)0x14:
    pQVar2 = in_RDI;
    iconFallbackPaths();
    ::QVariant::QVariant((QVariant *)pQVar2,(QList_conflict3 *)local_68);
    QList<QString>::~QList((QList<QString> *)0xae3eff);
    break;
  case (QPlatformTheme *)0x1f:
    pQVar2 = in_RDI;
    mouseCursorTheme();
    ::QVariant::QVariant((QVariant *)pQVar2,(QString *)local_f8);
    QString::~QString((QString *)0xae40d4);
    break;
  case (QPlatformTheme *)0x20:
    pQVar2 = in_RDI;
    QVar1 = mouseCursorSize();
    ::QVariant::QVariant((QVariant *)pQVar2,(QSize *)QVar1);
    break;
  case (QPlatformTheme *)0x23:
    ::QVariant::QVariant((QVariant *)in_RDI,true);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QVariant *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGenericUnixTheme::themeHint(ThemeHint hint) const
{
    switch (hint) {
    case QPlatformTheme::SystemIconFallbackThemeName:
        return QVariant(QString(QStringLiteral("hicolor")));
    case QPlatformTheme::IconThemeSearchPaths:
        return xdgIconThemePaths();
    case QPlatformTheme::IconFallbackSearchPaths:
        return iconFallbackPaths();
    case QPlatformTheme::DialogButtonBoxButtonsHaveIcons:
        return QVariant(true);
    case QPlatformTheme::StyleNames: {
        QStringList styleNames;
        styleNames << QStringLiteral("Fusion") << QStringLiteral("Windows");
        return QVariant(styleNames);
    }
    case QPlatformTheme::KeyboardScheme:
        return QVariant(int(X11KeyboardScheme));
    case QPlatformTheme::UiEffects:
        return QVariant(int(HoverEffect));
    case QPlatformTheme::MouseCursorTheme:
        return QVariant(mouseCursorTheme());
    case QPlatformTheme::MouseCursorSize:
        return QVariant(mouseCursorSize());
    case QPlatformTheme::PreferFileIconFromTheme:
        return true;
    default:
        break;
    }
    return QPlatformTheme::themeHint(hint);
}